

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.h
# Opt level: O3

void __thiscall
GlobOpt::TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::OptTagChecks(IR::Instr*)::__0>
          (GlobOpt *this,Instr *trackByteCodeUseOnInstr,anon_class_32_4_be7ea101 fn)

{
  Type pJVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  bool bVar3;
  ValueType newValueType;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  Value *value;
  PropertySym *local_48;
  PropertySym *tempPropertySymUse;
  PropertySym *local_38;
  
  tempPropertySymUse = (PropertySym *)this->byteCodeUses;
  local_38 = this->propertySymUse;
  local_48 = (PropertySym *)0x0;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  instrByteCodeStackSymUsed =
       (BVSparse<Memory::JitArenaAllocator> *)
       new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3eba5c);
  pJVar1 = this->tempAlloc;
  instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
  instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
  instrByteCodeStackSymUsed->alloc = pJVar1;
  instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
  pBVar2 = this->byteCodeUsesBeforeOpt;
  this->byteCodeUsesBeforeOpt = instrByteCodeStackSymUsed;
  this->propertySymUse = (PropertySym *)0x0;
  TrackByteCodeSymUsed(trackByteCodeUseOnInstr,instrByteCodeStackSymUsed,&local_48);
  bVar3 = TryHoistInvariant(fn.this,*fn.bailOutInstr,(fn.this)->currentBlock,(Value *)0x0,*fn.value,
                            (Value *)0x0,true,false,false,BailOutOnTaggedValue);
  if (bVar3) {
    value = GlobOptBlockData::FindValue
                      (&(fn.this)->currentBlock->loop->landingPad->globOptData,
                       &(*fn.stackSym)->super_Sym);
    newValueType = ValueType::SetCanBeTaggedValue(&value->valueInfo->super_ValueType,false);
    ChangeValueType(fn.this,(BasicBlock *)0x0,value,newValueType,false,false);
  }
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)tempPropertySymUse;
  this->propertySymUse = local_38;
  this->byteCodeUsesBeforeOpt = pBVar2;
  return;
}

Assistant:

void TrackByteCodeUsesForInstrAddedInOptInstr(IR::Instr * trackByteCodeUseOnInstr, Fn fn)
    {
        BVSparse<JitArenaAllocator> *currentBytecodeUses = this->byteCodeUses;
        PropertySym * currentPropertySymUse = this->propertySymUse;
        PropertySym * tempPropertySymUse = NULL;
        this->byteCodeUses = NULL;
        BVSparse<JitArenaAllocator> *tempByteCodeUse = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
#if DBG
        BVSparse<JitArenaAllocator> *currentBytecodeUsesBeforeOpt = this->byteCodeUsesBeforeOpt;
        this->byteCodeUsesBeforeOpt = tempByteCodeUse;
#endif
        this->propertySymUse = NULL;
        GlobOpt::TrackByteCodeSymUsed(trackByteCodeUseOnInstr, tempByteCodeUse, &tempPropertySymUse);

        fn();

        this->byteCodeUses = currentBytecodeUses;
        this->propertySymUse = currentPropertySymUse;
#if DBG
        this->byteCodeUsesBeforeOpt = currentBytecodeUsesBeforeOpt;
#endif
    }